

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O2

double __thiscall PhyloTree::getDistanceFromOrigin(PhyloTree *this)

{
  pointer pPVar1;
  double *pdVar2;
  PhyloTreeEdge *edge;
  pointer this_00;
  double dVar3;
  double dVar4;
  
  pPVar1 = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  dVar4 = 0.0;
  for (this_00 = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pPVar1; this_00 = this_00 + 1)
  {
    dVar3 = PhyloTreeEdge::getLength(this_00);
    dVar4 = dVar4 + dVar3 * dVar3;
  }
  for (pdVar2 = (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar2 != (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar2 = pdVar2 + 1) {
    dVar4 = dVar4 + *pdVar2 * *pdVar2;
  }
  if (0.0 <= dVar4) {
    return SQRT(dVar4);
  }
  dVar4 = sqrt(dVar4);
  return dVar4;
}

Assistant:

double PhyloTree::getDistanceFromOrigin() {
    double dist = 0;
    for (auto &edge : edges) {
        dist += std::pow(edge.getLength(), 2);
    }

    for (auto attrib : leafEdgeLengths) {
        dist += std::pow(attrib, 2);
    }

    return std::sqrt(dist);
}